

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void regprint(regex_t *r,FILE *d)

{
  sop *psVar1;
  re_guts *prVar2;
  cat_t *pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  long *plVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  sop *psVar15;
  int iVar16;
  int nincat [256];
  long local_440;
  uint local_438 [258];
  ulong uVar10;
  
  prVar2 = r->re_g;
  fprintf((FILE *)d,"%ld states, %d categories",prVar2->nstates,(ulong)(uint)prVar2->ncategories);
  fprintf((FILE *)d,", first %ld last %ld",prVar2->firststate,prVar2->laststate);
  if ((prVar2->iflags & 1) != 0) {
    fwrite(", USEBOL",8,1,(FILE *)d);
  }
  if ((prVar2->iflags & 2) != 0) {
    fwrite(", USEEOL",8,1,(FILE *)d);
  }
  if ((prVar2->iflags & 4) != 0) {
    fwrite(", BAD",5,1,(FILE *)d);
  }
  if (prVar2->nsub != 0) {
    fprintf((FILE *)d,", nsub=%ld");
  }
  if (prVar2->must != (char *)0x0) {
    fprintf((FILE *)d,", must(%ld) `%*s\'",(long)prVar2->mlen);
  }
  if (prVar2->backrefs != 0) {
    fwrite(", backrefs",10,1,(FILE *)d);
  }
  if (0 < prVar2->nplus) {
    fprintf((FILE *)d,", nplus %ld");
  }
  fputc(10,(FILE *)d);
  if ((*(uint *)prVar2->strip & 0x7c000000) != 0x4000000) {
    fwrite("missing initial OEND!\n",0x16,1,(FILE *)d);
  }
  psVar15 = prVar2->strip;
  local_440 = 2;
  iVar16 = 0;
  bVar5 = false;
  do {
    psVar1 = psVar15 + 1;
    psVar15 = psVar15 + 1;
    uVar6 = (uint)*psVar1;
    uVar9 = uVar6 & 0x3ffffff;
    uVar10 = (ulong)uVar9;
    uVar8 = (ulong)(uVar6 & 0x7c000000);
    switch(uVar8 - 0x4000000 >> 0x1a) {
    case 0:
      fputc(10,(FILE *)d);
      bVar5 = true;
      break;
    case 1:
      uVar6 = (uint)(char)*psVar1;
      pvVar7 = memchr("\\|()^$.[+*?{}!<> ",uVar6,0x12);
      if (pvVar7 == (void *)0x0) {
        regchar(uVar6);
        fputs(regchar::buf,(FILE *)d);
      }
      else {
        fprintf((FILE *)d,"\\%c",(ulong)uVar6);
      }
      break;
    case 2:
      iVar13 = 0x5e;
      goto LAB_0010a53b;
    case 3:
      iVar13 = 0x24;
      goto LAB_0010a53b;
    case 4:
      iVar13 = 0x2e;
      goto LAB_0010a53b;
    case 5:
      fprintf((FILE *)d,"[(%ld)",uVar10);
      iVar13 = prVar2->csetsize;
      if (-1 < iVar13) {
        plVar11 = (long *)((long)&prVar2->sets->ptr + (ulong)(uVar9 << 5));
        uVar9 = 0xffffffff;
        uVar6 = 0;
        do {
          if (((int)uVar6 < iVar13) &&
             ((*(byte *)(plVar11 + 1) & *(byte *)(*plVar11 + (ulong)(uVar6 & 0xff))) != 0)) {
            if ((int)uVar9 < 0) {
              regchar(uVar6);
              fputs(regchar::buf,(FILE *)d);
              uVar9 = uVar6;
            }
          }
          else if (-1 < (int)uVar9) {
            if (uVar6 - 1 != uVar9) {
              regchar(uVar6 - 1);
              fprintf((FILE *)d,"-%s",regchar::buf);
            }
            uVar9 = 0xffffffff;
          }
          iVar13 = prVar2->csetsize;
          bVar4 = (int)uVar6 < iVar13;
          uVar6 = uVar6 + 1;
        } while (bVar4);
      }
      fputc(0x5d,(FILE *)d);
      break;
    case 6:
      pcVar14 = "(\\<%ld>";
      goto LAB_0010a6a6;
    case 7:
      pcVar14 = "<%ld>\\)";
      goto LAB_0010a6a6;
    case 8:
      fwrite("(+",2,1,(FILE *)d);
      if ((*(uint *)(psVar15 + uVar10) & 0x7c000000) != 0x28000000) {
LAB_0010a69c:
        pcVar14 = "<%ld>";
        goto LAB_0010a6a6;
      }
      break;
    case 9:
      if ((*(uint *)((long)psVar15 - (ulong)(uVar9 * 8)) & 0x7c000000) != 0x24000000) {
        fprintf((FILE *)d,"<%ld>",uVar10);
      }
      pcVar14 = "+)";
      goto LAB_0010a6c3;
    case 10:
      fwrite("(?",2,1,(FILE *)d);
      if ((*(uint *)(psVar15 + uVar10) & 0x7c000000) != 0x30000000) goto LAB_0010a69c;
      break;
    case 0xb:
      if ((*(uint *)((long)psVar15 - (ulong)(uVar9 * 8)) & 0x7c000000) != 0x2c000000) {
        fprintf((FILE *)d,"<%ld>",uVar10);
      }
      pcVar14 = "?)";
      goto LAB_0010a6c3;
    case 0xc:
      pcVar14 = "((<%ld>";
      goto LAB_0010a6a6;
    case 0xd:
      pcVar14 = "<%ld>))";
LAB_0010a6a6:
      fprintf((FILE *)d,pcVar14,uVar10);
      break;
    case 0xe:
      fputc(0x3c,(FILE *)d);
      if ((*(uint *)(psVar15 + uVar10) & 0x7c000000) != 0x44000000) goto LAB_0010a69c;
      break;
    case 0xf:
      uVar6 = (uint)*(undefined8 *)((long)psVar15 - (ulong)(uVar9 * 8)) & 0x7c000000;
      if ((uVar6 != 0x3c000000) && (uVar6 != 0x40000000)) {
        fprintf((FILE *)d,"<%ld>",uVar10);
      }
      iVar13 = 0x7c;
      goto LAB_0010a53b;
    case 0x10:
      fputc(0x7c,(FILE *)d);
      uVar6 = (uint)psVar15[uVar10] & 0x7c000000;
      if ((uVar6 != 0x44000000) && (uVar6 != 0x48000000)) goto LAB_0010a69c;
      break;
    case 0x11:
      if ((*(uint *)((long)psVar15 - (ulong)(uVar9 * 8)) & 0x7c000000) != 0x40000000) {
        fprintf((FILE *)d,"<%ld>",uVar10);
      }
      iVar13 = 0x3e;
LAB_0010a53b:
      fputc(iVar13,(FILE *)d);
      break;
    case 0x12:
      pcVar14 = "\\{";
      goto LAB_0010a6c3;
    case 0x13:
      pcVar14 = "\\}";
LAB_0010a6c3:
      fwrite(pcVar14,2,1,(FILE *)d);
      break;
    default:
      fprintf((FILE *)d,"!%ld(%ld)!",uVar8,uVar10);
    }
    if (!bVar5) {
      if (local_440 * -0x3333333333333333 + 0x1999999999999999U < 0x3333333333333333) {
        if (iVar16 < 0x29) {
          fputc(0x20,(FILE *)d);
          goto LAB_0010a715;
        }
        fwrite("\n\t",2,1,(FILE *)d);
        iVar16 = 0;
      }
      else {
LAB_0010a715:
        iVar16 = iVar16 + 1;
      }
      local_440 = local_440 + 1;
    }
    if (bVar5) {
      iVar16 = prVar2->ncategories;
      if (0 < (long)iVar16) {
        pcVar3 = prVar2->categories;
        uVar8 = 0;
        do {
          local_438[uVar8] = 0;
          lVar12 = -0x80;
          do {
            if (uVar8 == pcVar3[lVar12]) {
              local_438[uVar8] = local_438[uVar8] + 1;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x80);
          uVar8 = uVar8 + 1;
        } while (uVar8 != (long)iVar16);
      }
      fprintf((FILE *)d,"cc0#%d",(ulong)local_438[0]);
      if (1 < prVar2->ncategories) {
        uVar8 = 1;
        do {
          if (local_438[uVar8] == 1) {
            lVar12 = -0x80;
            do {
              if (uVar8 == prVar2->categories[lVar12]) goto LAB_0010a7fc;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0x80);
            lVar12 = 0x80;
LAB_0010a7fc:
            regchar((int)lVar12);
            fprintf((FILE *)d,", %d=%s",uVar8 & 0xffffffff,regchar::buf);
          }
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < (long)prVar2->ncategories);
      }
      fputc(10,(FILE *)d);
      if (1 < prVar2->ncategories) {
        uVar8 = 1;
        do {
          if (local_438[uVar8] != 1) {
            fprintf((FILE *)d,"cc%d\t",uVar8 & 0xffffffff);
            iVar16 = -1;
            lVar12 = -0x80;
            do {
              iVar13 = (int)lVar12;
              if ((lVar12 == 0x80) || (uVar8 != prVar2->categories[lVar12])) {
                if (-1 < iVar16) {
                  if (iVar13 + -1 != iVar16) {
                    regchar(iVar13 + -1);
                    fprintf((FILE *)d,"-%s",regchar::buf);
                  }
                  iVar16 = -1;
                }
              }
              else if (iVar16 < 0) {
                regchar(iVar13);
                fputs(regchar::buf,(FILE *)d);
                iVar16 = iVar13;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0x81);
            fputc(10,(FILE *)d);
          }
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < (long)prVar2->ncategories);
      }
      return;
    }
  } while( true );
}

Assistant:

void
regprint(r, d)
regex_t *r;
FILE *d;
{
	struct re_guts *g = r->re_g;
	int i;
	int c;
	int last;
	int nincat[NC];

	fprintf(d, "%ld states, %d categories", (long)g->nstates,
							g->ncategories);
	fprintf(d, ", first %ld last %ld", (long)g->firststate,
						(long)g->laststate);
	if (g->iflags&USEBOL)
		fprintf(d, ", USEBOL");
	if (g->iflags&USEEOL)
		fprintf(d, ", USEEOL");
	if (g->iflags&BAD)
		fprintf(d, ", BAD");
	if (g->nsub > 0)
		fprintf(d, ", nsub=%ld", (long)g->nsub);
	if (g->must != NULL)
		fprintf(d, ", must(%ld) `%*s'", (long)g->mlen, (int)g->mlen,
								g->must);
	if (g->backrefs)
		fprintf(d, ", backrefs");
	if (g->nplus > 0)
		fprintf(d, ", nplus %ld", (long)g->nplus);
	fprintf(d, "\n");
	s_print(g, d);
	for (i = 0; i < g->ncategories; i++) {
		nincat[i] = 0;
		for (c = CHAR_MIN; c <= CHAR_MAX; c++)
			if (g->categories[c] == i)
				nincat[i]++;
	}
	fprintf(d, "cc0#%d", nincat[0]);
	for (i = 1; i < g->ncategories; i++)
		if (nincat[i] == 1) {
			for (c = CHAR_MIN; c <= CHAR_MAX; c++)
				if (g->categories[c] == i)
					break;
			fprintf(d, ", %d=%s", i, regchar(c));
		}
	fprintf(d, "\n");
	for (i = 1; i < g->ncategories; i++)
		if (nincat[i] != 1) {
			fprintf(d, "cc%d\t", i);
			last = -1;
			for (c = CHAR_MIN; c <= CHAR_MAX+1; c++)	/* +1 does flush */
				if (c <= CHAR_MAX && g->categories[c] == i) {
					if (last < 0) {
						fprintf(d, "%s", regchar(c));
						last = c;
					}
				} else {
					if (last >= 0) {
						if (last != c-1)
							fprintf(d, "-%s",
								regchar(c-1));
						last = -1;
					}
				}
			fprintf(d, "\n");
		}
}